

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_get_populated_multiple(planck_unit_test_t *tc)

{
  int local_84;
  int local_80;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,ion_fill_low
             );
  for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
    local_80 = local_7c;
    local_84 = local_7c << 1;
    bhdct_get(tc,(ion_dictionary_t *)local_78,&local_80,&local_84,'\0',1);
  }
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_get_populated_multiple(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_low);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_LOW_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}